

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

int Scl_LibertyParseDump(Scl_Tree_t *p,char *pFileName)

{
  Scl_Item_t *pItem;
  FILE *local_28;
  FILE *pFile;
  char *pFileName_local;
  Scl_Tree_t *p_local;
  
  if (pFileName == (char *)0x0) {
    local_28 = _stdout;
  }
  else {
    local_28 = fopen(pFileName,"w");
    if (local_28 == (FILE *)0x0) {
      printf("Scl_LibertyParseDump(): The output file is unavailable (absent or open).\n");
      return 0;
    }
  }
  pItem = Scl_LibertyRoot(p);
  Scl_LibertyParseDumpItem((FILE *)local_28,p,pItem,0);
  if (local_28 != _stdout) {
    fclose(local_28);
  }
  return 1;
}

Assistant:

int Scl_LibertyParseDump( Scl_Tree_t * p, char * pFileName )
{
    FILE * pFile;
    if ( pFileName == NULL )
        pFile = stdout;
    else
    {
        pFile = fopen( pFileName, "w" );
        if ( pFile == NULL )
        {
            printf( "Scl_LibertyParseDump(): The output file is unavailable (absent or open).\n" );
            return 0;
        }
    }
    Scl_LibertyParseDumpItem( pFile, p, Scl_LibertyRoot(p), 0 );
    if ( pFile != stdout )
        fclose( pFile );
    return 1;
}